

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void fe_pow22523(fe *out,fe *z)

{
  int local_94;
  undefined1 local_90 [4];
  int i;
  fe t2;
  fe t1;
  fe t0;
  fe *z_local;
  fe *out_local;
  
  fe_sq_tt((fe *)(t1.v + 4),z);
  fe_sq_tt((fe *)(t2.v + 4),(fe *)(t1.v + 4));
  for (local_94 = 1; local_94 < 2; local_94 = local_94 + 1) {
    fe_sq_tt((fe *)(t2.v + 4),(fe *)(t2.v + 4));
  }
  fe_mul_ttt((fe *)(t2.v + 4),z,(fe *)(t2.v + 4));
  fe_mul_ttt((fe *)(t1.v + 4),(fe *)(t1.v + 4),(fe *)(t2.v + 4));
  fe_sq_tt((fe *)(t1.v + 4),(fe *)(t1.v + 4));
  fe_mul_ttt((fe *)(t1.v + 4),(fe *)(t2.v + 4),(fe *)(t1.v + 4));
  fe_sq_tt((fe *)(t2.v + 4),(fe *)(t1.v + 4));
  for (local_94 = 1; local_94 < 5; local_94 = local_94 + 1) {
    fe_sq_tt((fe *)(t2.v + 4),(fe *)(t2.v + 4));
  }
  fe_mul_ttt((fe *)(t1.v + 4),(fe *)(t2.v + 4),(fe *)(t1.v + 4));
  fe_sq_tt((fe *)(t2.v + 4),(fe *)(t1.v + 4));
  for (local_94 = 1; local_94 < 10; local_94 = local_94 + 1) {
    fe_sq_tt((fe *)(t2.v + 4),(fe *)(t2.v + 4));
  }
  fe_mul_ttt((fe *)(t2.v + 4),(fe *)(t2.v + 4),(fe *)(t1.v + 4));
  fe_sq_tt((fe *)local_90,(fe *)(t2.v + 4));
  for (local_94 = 1; local_94 < 0x14; local_94 = local_94 + 1) {
    fe_sq_tt((fe *)local_90,(fe *)local_90);
  }
  fe_mul_ttt((fe *)(t2.v + 4),(fe *)local_90,(fe *)(t2.v + 4));
  fe_sq_tt((fe *)(t2.v + 4),(fe *)(t2.v + 4));
  for (local_94 = 1; local_94 < 10; local_94 = local_94 + 1) {
    fe_sq_tt((fe *)(t2.v + 4),(fe *)(t2.v + 4));
  }
  fe_mul_ttt((fe *)(t1.v + 4),(fe *)(t2.v + 4),(fe *)(t1.v + 4));
  fe_sq_tt((fe *)(t2.v + 4),(fe *)(t1.v + 4));
  for (local_94 = 1; local_94 < 0x32; local_94 = local_94 + 1) {
    fe_sq_tt((fe *)(t2.v + 4),(fe *)(t2.v + 4));
  }
  fe_mul_ttt((fe *)(t2.v + 4),(fe *)(t2.v + 4),(fe *)(t1.v + 4));
  fe_sq_tt((fe *)local_90,(fe *)(t2.v + 4));
  for (local_94 = 1; local_94 < 100; local_94 = local_94 + 1) {
    fe_sq_tt((fe *)local_90,(fe *)local_90);
  }
  fe_mul_ttt((fe *)(t2.v + 4),(fe *)local_90,(fe *)(t2.v + 4));
  fe_sq_tt((fe *)(t2.v + 4),(fe *)(t2.v + 4));
  for (local_94 = 1; local_94 < 0x32; local_94 = local_94 + 1) {
    fe_sq_tt((fe *)(t2.v + 4),(fe *)(t2.v + 4));
  }
  fe_mul_ttt((fe *)(t1.v + 4),(fe *)(t2.v + 4),(fe *)(t1.v + 4));
  fe_sq_tt((fe *)(t1.v + 4),(fe *)(t1.v + 4));
  for (local_94 = 1; local_94 < 2; local_94 = local_94 + 1) {
    fe_sq_tt((fe *)(t1.v + 4),(fe *)(t1.v + 4));
  }
  fe_mul_ttt(out,(fe *)(t1.v + 4),z);
  return;
}

Assistant:

static void fe_pow22523(fe *out, const fe *z) {
  fe t0;
  fe t1;
  fe t2;
  int i;

  fe_sq_tt(&t0, z);
  fe_sq_tt(&t1, &t0);
  for (i = 1; i < 2; ++i) {
    fe_sq_tt(&t1, &t1);
  }
  fe_mul_ttt(&t1, z, &t1);
  fe_mul_ttt(&t0, &t0, &t1);
  fe_sq_tt(&t0, &t0);
  fe_mul_ttt(&t0, &t1, &t0);
  fe_sq_tt(&t1, &t0);
  for (i = 1; i < 5; ++i) {
    fe_sq_tt(&t1, &t1);
  }
  fe_mul_ttt(&t0, &t1, &t0);
  fe_sq_tt(&t1, &t0);
  for (i = 1; i < 10; ++i) {
    fe_sq_tt(&t1, &t1);
  }
  fe_mul_ttt(&t1, &t1, &t0);
  fe_sq_tt(&t2, &t1);
  for (i = 1; i < 20; ++i) {
    fe_sq_tt(&t2, &t2);
  }
  fe_mul_ttt(&t1, &t2, &t1);
  fe_sq_tt(&t1, &t1);
  for (i = 1; i < 10; ++i) {
    fe_sq_tt(&t1, &t1);
  }
  fe_mul_ttt(&t0, &t1, &t0);
  fe_sq_tt(&t1, &t0);
  for (i = 1; i < 50; ++i) {
    fe_sq_tt(&t1, &t1);
  }
  fe_mul_ttt(&t1, &t1, &t0);
  fe_sq_tt(&t2, &t1);
  for (i = 1; i < 100; ++i) {
    fe_sq_tt(&t2, &t2);
  }
  fe_mul_ttt(&t1, &t2, &t1);
  fe_sq_tt(&t1, &t1);
  for (i = 1; i < 50; ++i) {
    fe_sq_tt(&t1, &t1);
  }
  fe_mul_ttt(&t0, &t1, &t0);
  fe_sq_tt(&t0, &t0);
  for (i = 1; i < 2; ++i) {
    fe_sq_tt(&t0, &t0);
  }
  fe_mul_ttt(out, &t0, z);
}